

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall ON_Texture::SwapTextureCoordinate(ON_Texture *this,int i,int j)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  ON_Xform *pOVar6;
  double *pdVar7;
  ON_Xform *pOVar8;
  bool bVar9;
  byte bVar10;
  ON_Xform x;
  ON_Xform local_a0;
  
  bVar10 = 0;
  uVar1 = (ulong)(uint)i;
  bVar9 = (uint)(j | i) < 4;
  if (bVar9 && i != j) {
    lVar4 = 0x10;
    pdVar5 = (double *)&ON_Xform::IdentityTransformation;
    pdVar7 = (double *)&x;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar7 = *pdVar5;
      pdVar5 = pdVar5 + 1;
      pdVar7 = pdVar7 + 1;
    }
    uVar2 = (ulong)(uint)j;
    *(undefined8 *)((long)x.m_xform + uVar2 * 0x28) = 0;
    *(undefined8 *)((long)x.m_xform + uVar1 * 0x28) = 0;
    x.m_xform[uVar2][uVar1] = 1.0;
    x.m_xform[uVar1][uVar2] = 1.0;
    ON_Xform::operator*(&local_a0,&x,&this->m_uvw);
    pOVar6 = &local_a0;
    pOVar8 = &this->m_uvw;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      pOVar8->m_xform[0][0] = pOVar6->m_xform[0][0];
      pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      pOVar8 = (ON_Xform *)((long)pOVar8 + (ulong)bVar10 * -0x10 + 8);
    }
  }
  return bVar9 && i != j;
}

Assistant:

bool ON_Texture::SwapTextureCoordinate( int i, int j )
{
  bool rc = false;
  if (i!=j && 0 <= i && i <= 3 && 0 <= j && j <= 3)
  {
    ON_Xform x(ON_Xform::IdentityTransformation);
    x.m_xform[i][i] = x.m_xform[j][j] = 0.0;
    x.m_xform[i][j] = x.m_xform[j][i] = 1.0;
    m_uvw = x*m_uvw;
    rc = true;
  }
  return rc;
}